

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::
DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doApply(IRet *__return_storage_ptr__,
         DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
         *this,EvalContext *ctx,IArgs *args)

{
  long *plVar1;
  Expr<tcu::Vector<float,_2>_> *pEVar2;
  Vector<tcu::Interval,_2> *pVVar3;
  Interval *pIVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  undefined7 uVar9;
  bool bVar10;
  undefined7 uVar11;
  pointer pSVar12;
  IVal *pIVar13;
  IVal *pIVar14;
  long lVar15;
  ulong uVar16;
  Environment funEnv;
  EvalContext funCtx;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  _Stack_d8;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  YesNoMaybe YStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  double local_88;
  Precision local_80;
  undefined1 *local_78;
  int local_70;
  undefined8 local_60;
  double dStack_58;
  double local_50;
  undefined8 uStack_48;
  double local_40;
  double dStack_38;
  
  _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_d8._M_impl.super__Rb_tree_header._M_header;
  _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar15 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar15 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar15 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar15) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x40);
  lVar15 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar15 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar15 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar15) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 == 0x28);
  _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  initialize(this);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&_Stack_d8,
             (this->m_var0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,args->a);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&_Stack_d8,
             (this->m_var1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,args->b);
  Environment::bind<float>
            ((Environment *)&_Stack_d8,
             (this->m_var2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,args->c
            );
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&_Stack_d8,
             (this->m_var3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,args->d);
  local_80 = ctx->floatPrecision;
  local_70 = ctx->callDepth;
  local_88 = (ctx->format).m_maxValue;
  local_a8 = (ctx->format).m_minExp;
  iStack_a4 = (ctx->format).m_maxExp;
  iStack_a0 = (ctx->format).m_fractionBits;
  YStack_9c = (ctx->format).m_hasSubnormal;
  local_98._0_4_ = (ctx->format).m_hasInf;
  local_98._4_4_ = (ctx->format).m_hasNaN;
  uStack_90 = *(undefined8 *)&(ctx->format).m_exactPrecision;
  pSVar12 = (this->m_body).
            super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_78 = (undefined1 *)&_Stack_d8;
  if ((this->m_body).
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar12) {
    lVar15 = 0;
    uVar16 = 0;
    local_78 = (undefined1 *)&_Stack_d8;
    do {
      plVar1 = *(long **)((long)&(pSVar12->
                                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>)
                                 .m_ptr + lVar15);
      (**(code **)(*plVar1 + 0x18))(plVar1,&local_a8);
      uVar16 = uVar16 + 1;
      pSVar12 = (this->m_body).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar15 = lVar15 + 0x10;
    } while (uVar16 < (ulong)((long)(this->m_body).
                                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar12 >> 4)
            );
  }
  pEVar2 = (this->m_ret).super_ContainerExprPBase<tcu::Vector<float,_2>_>.
           super_ExprPBase<tcu::Vector<float,_2>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
           m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[4])(&local_60,pEVar2,&local_a8);
  __return_storage_ptr__->m_data[1].m_lo = local_40;
  __return_storage_ptr__->m_data[1].m_hi = dStack_38;
  __return_storage_ptr__->m_data[0].m_hi = local_50;
  *(undefined8 *)(__return_storage_ptr__->m_data + 1) = uStack_48;
  *(undefined8 *)__return_storage_ptr__->m_data = local_60;
  __return_storage_ptr__->m_data[0].m_lo = dStack_58;
  pIVar13 = Environment::lookup<tcu::Vector<float,2>>
                      ((Environment *)&_Stack_d8,
                       (this->m_var0).
                       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                       .m_ptr);
  pVVar3 = args->a;
  bVar10 = pIVar13->m_data[0].m_hasNaN;
  uVar11 = *(undefined7 *)&pIVar13->m_data[0].field_0x1;
  dVar5 = pIVar13->m_data[0].m_lo;
  dVar6 = pIVar13->m_data[0].m_hi;
  bVar8 = pIVar13->m_data[1].m_hasNaN;
  uVar9 = *(undefined7 *)&pIVar13->m_data[1].field_0x1;
  dVar7 = pIVar13->m_data[1].m_hi;
  pVVar3->m_data[1].m_lo = pIVar13->m_data[1].m_lo;
  pVVar3->m_data[1].m_hi = dVar7;
  pVVar3->m_data[0].m_hi = dVar6;
  pVVar3->m_data[1].m_hasNaN = bVar8;
  *(undefined7 *)&pVVar3->m_data[1].field_0x1 = uVar9;
  pVVar3->m_data[0].m_hasNaN = bVar10;
  *(undefined7 *)&pVVar3->m_data[0].field_0x1 = uVar11;
  pVVar3->m_data[0].m_lo = dVar5;
  pIVar13 = Environment::lookup<tcu::Vector<float,2>>
                      ((Environment *)&_Stack_d8,
                       (this->m_var1).
                       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                       .m_ptr);
  pVVar3 = args->b;
  bVar10 = pIVar13->m_data[0].m_hasNaN;
  uVar11 = *(undefined7 *)&pIVar13->m_data[0].field_0x1;
  dVar5 = pIVar13->m_data[0].m_lo;
  dVar6 = pIVar13->m_data[0].m_hi;
  bVar8 = pIVar13->m_data[1].m_hasNaN;
  uVar9 = *(undefined7 *)&pIVar13->m_data[1].field_0x1;
  dVar7 = pIVar13->m_data[1].m_hi;
  pVVar3->m_data[1].m_lo = pIVar13->m_data[1].m_lo;
  pVVar3->m_data[1].m_hi = dVar7;
  pVVar3->m_data[0].m_hi = dVar6;
  pVVar3->m_data[1].m_hasNaN = bVar8;
  *(undefined7 *)&pVVar3->m_data[1].field_0x1 = uVar9;
  pVVar3->m_data[0].m_hasNaN = bVar10;
  *(undefined7 *)&pVVar3->m_data[0].field_0x1 = uVar11;
  pVVar3->m_data[0].m_lo = dVar5;
  pIVar14 = Environment::lookup<float>
                      ((Environment *)&_Stack_d8,
                       (this->m_var2).
                       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.
                       m_ptr);
  pIVar4 = args->c;
  pIVar4->m_hi = pIVar14->m_hi;
  uVar9 = *(undefined7 *)&pIVar14->field_0x1;
  dVar5 = pIVar14->m_lo;
  pIVar4->m_hasNaN = pIVar14->m_hasNaN;
  *(undefined7 *)&pIVar4->field_0x1 = uVar9;
  pIVar4->m_lo = dVar5;
  Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&_Stack_d8,
             (this->m_var3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&_Stack_d8);
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext&	ctx,
												 const IArgs&		args) const
	{
		Environment	funEnv;
		IArgs&		mutArgs		= const_cast<IArgs&>(args);
		IRet		ret;

		initialize();

		funEnv.bind(*m_var0, args.a);
		funEnv.bind(*m_var1, args.b);
		funEnv.bind(*m_var2, args.c);
		funEnv.bind(*m_var3, args.d);

		{
			EvalContext	funCtx(ctx.format, ctx.floatPrecision, funEnv, ctx.callDepth);

			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->execute(funCtx);

			ret = m_ret->evaluate(funCtx);
		}

		// \todo [lauri] Store references instead of values in environment
		const_cast<IArg0&>(mutArgs.a) = funEnv.lookup(*m_var0);
		const_cast<IArg1&>(mutArgs.b) = funEnv.lookup(*m_var1);
		const_cast<IArg2&>(mutArgs.c) = funEnv.lookup(*m_var2);
		const_cast<IArg3&>(mutArgs.d) = funEnv.lookup(*m_var3);

		return ret;
	}